

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

void Aig_ManSupportsTest(Aig_Man_t *pMan)

{
  int iVar1;
  void **__ptr;
  void *__ptr_00;
  Vec_Ptr_t *__ptr_01;
  long lVar2;
  
  __ptr_01 = Aig_ManSupports(pMan);
  iVar1 = __ptr_01->nSize;
  __ptr = __ptr_01->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (void **)0x0) goto LAB_006960cb;
  }
  else {
    lVar2 = 0;
    do {
      __ptr_00 = __ptr[lVar2];
      if (__ptr_00 != (void *)0x0) {
        if (*(void **)((long)__ptr_00 + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr_00 + 8));
        }
        free(__ptr_00);
      }
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  free(__ptr);
LAB_006960cb:
  free(__ptr_01);
  return;
}

Assistant:

void Aig_ManSupportsTest( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vSupps;
    vSupps = Aig_ManSupports( pMan );
    Vec_VecFree( (Vec_Vec_t *)vSupps );
}